

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

int parseHexString(string *hex,uchar *dest)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    uVar3 = hex->_M_string_length;
    if (uVar3 <= uVar4) {
      return (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 2);
    }
    iVar1 = tolower((int)(hex->_M_dataplus)._M_p[uVar4]);
    if (iVar1 - 0x61U < 6) {
      uVar2 = iVar1 - 0x57;
    }
    else {
      uVar2 = iVar1 - 0x30;
      if (9 < uVar2) {
        return -1;
      }
    }
    uVar3 = uVar4 >> 1;
    if ((uVar4 & 1) == 0) {
      dest[uVar3] = (byte)uVar2;
    }
    else {
      dest[uVar3] = dest[uVar3] << 4 | (byte)uVar2;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int parseHexString(std::string& hex, unsigned char* dest)
{
	for (size_t i = 0; i < hex.size(); i++)
	{
		int source = tolower(hex[i]);
		int value;

		if (source >= 'a' && source <= 'f')
		{
			value = source-'a'+10;
		} else if (source >= '0' && source <= '9')
		{
			value = source-'0';
		} else {
			return -1;
		}

		size_t index = i/2;
		if (i % 2)
			dest[index] = (dest[index] << 4) | value;
		else
			dest[index] = value;
	}

	return (int) hex.size()/2;
}